

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_reader.cpp
# Opt level: O2

ssize_t __thiscall diffusion::NetReader::read(NetReader *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  ssize_t extraout_RAX;
  ErrorNoData *this_00;
  undefined4 in_register_00000034;
  allocator_type local_29;
  vector<char,_std::allocator<char>_> data;
  
  iVar1 = (**(this->super_Reader)._vptr_Reader)();
  if ((char)iVar1 != '\0') {
    std::vector<char,_std::allocator<char>_>::vector(&data,0,&local_29);
    Tokenizer::pop(&this->data_queue_,&data);
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)CONCAT44(in_register_00000034,__fd),&data);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&data.super__Vector_base<char,_std::allocator<char>_>);
    return extraout_RAX;
  }
  this_00 = (ErrorNoData *)__cxa_allocate_exception(0x10);
  ErrorNoData::ErrorNoData(this_00);
  __cxa_throw(this_00,&ErrorNoData::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NetReader::read(std::vector<char> &buffer) {
    if (this->can_read()) {
        // Assuming single thread.
        std::vector<char> data(0);
        data_queue_.pop(data);
        buffer = data;
    } else {
        throw ErrorNoData();
    }
}